

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_root.c
# Opt level: O3

int arkRootCheck3(void *arkode_mem)

{
  double dVar1;
  undefined8 *puVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  
  if (arkode_mem == (void *)0x0) {
    iVar4 = -0x15;
    arkProcessError((ARKodeMem)0x0,-0x15,0x26f,"arkRootCheck3",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_root.c"
                    ,"arkode_mem = NULL illegal.");
  }
  else {
    puVar2 = *(undefined8 **)((long)arkode_mem + 0x3d8);
    iVar4 = *(int *)(puVar2 + 0xc);
    if (iVar4 == 2) {
      puVar2[5] = *(undefined8 *)((long)arkode_mem + 0x2f0);
      N_VScale(0x3ff0000000000000,*(undefined8 *)((long)arkode_mem + 0x250));
      iVar4 = *(int *)(puVar2 + 0xc);
    }
    if (iVar4 == 1) {
      dVar1 = (double)puVar2[10];
      if (0.0 <= (dVar1 - *(double *)((long)arkode_mem + 0x2f0)) *
                 *(double *)((long)arkode_mem + 0x2c0)) {
        puVar2[5] = *(double *)((long)arkode_mem + 0x2f0);
        N_VScale(0x3ff0000000000000,*(undefined8 *)((long)arkode_mem + 0x250),
                 *(undefined8 *)((long)arkode_mem + 0x248));
      }
      else {
        puVar2[5] = dVar1;
        ARKodeGetDky(arkode_mem,dVar1,0,*(N_Vector *)((long)arkode_mem + 0x248));
      }
    }
    iVar5 = (*(code *)*puVar2)(puVar2[5],*(undefined8 *)((long)arkode_mem + 0x248),puVar2[8],
                               puVar2[0x10]);
    puVar2[0xd] = puVar2[0xd] + 1;
    iVar4 = -0xc;
    if (iVar5 == 0) {
      puVar2[0xb] = (ABS(*(double *)((long)arkode_mem + 0x2c0)) +
                    ABS(*(double *)((long)arkode_mem + 0x2f0))) * *(double *)((long)arkode_mem + 8)
                    * 100.0;
      iVar5 = arkRootfind(arkode_mem);
      if (iVar5 != -0xc) {
        uVar6 = *(uint *)(puVar2 + 1);
        if ((int)uVar6 < 1) {
          puVar2[4] = puVar2[6];
        }
        else {
          lVar3 = puVar2[0xe];
          lVar7 = 0;
          do {
            if ((*(int *)(lVar3 + lVar7 * 4) == 0) &&
               ((dVar1 = *(double *)(puVar2[9] + lVar7 * 8), dVar1 != 0.0 || (NAN(dVar1))))) {
              *(undefined4 *)(lVar3 + lVar7 * 4) = 1;
              uVar6 = *(uint *)(puVar2 + 1);
            }
            lVar7 = lVar7 + 1;
          } while (lVar7 < (int)uVar6);
          puVar2[4] = puVar2[6];
          if (0 < (int)uVar6) {
            lVar3 = puVar2[7];
            lVar7 = puVar2[9];
            uVar8 = 0;
            do {
              *(undefined8 *)(lVar3 + uVar8 * 8) = *(undefined8 *)(lVar7 + uVar8 * 8);
              uVar8 = uVar8 + 1;
            } while (uVar6 != uVar8);
          }
        }
        if (iVar5 == 0) {
          iVar4 = 0;
        }
        else {
          ARKodeGetDky(arkode_mem,(sunrealtype)puVar2[6],0,*(N_Vector *)((long)arkode_mem + 0x248));
          iVar4 = 1;
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int arkRootCheck3(void* arkode_mem)
{
  int i, retval, ier;
  ARKodeMem ark_mem;
  ARKodeRootMem rootmem;
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;
  rootmem = ark_mem->root_mem;

  /* Set thi = tn or tout, whichever comes first; set y = y(thi). */
  if (rootmem->taskc == ARK_ONE_STEP)
  {
    rootmem->thi = ark_mem->tcur;
    N_VScale(ONE, ark_mem->yn, ark_mem->ycur);
  }
  if (rootmem->taskc == ARK_NORMAL)
  {
    if ((rootmem->toutc - ark_mem->tcur) * ark_mem->h >= ZERO)
    {
      rootmem->thi = ark_mem->tcur;
      N_VScale(ONE, ark_mem->yn, ark_mem->ycur);
    }
    else
    {
      rootmem->thi = rootmem->toutc;
      (void)ARKodeGetDky(ark_mem, rootmem->thi, 0, ark_mem->ycur);
    }
  }

  /* Set rootmem->ghi = g(thi) and call arkRootfind to search (tlo,thi) for roots. */
  retval = rootmem->gfun(rootmem->thi, ark_mem->ycur, rootmem->ghi,
                         rootmem->root_data);
  rootmem->nge++;
  if (retval != 0) { return (ARK_RTFUNC_FAIL); }

  rootmem->ttol = (SUNRabs(ark_mem->tcur) + SUNRabs(ark_mem->h)) *
                  ark_mem->uround * HUND;
  ier = arkRootfind(ark_mem);
  if (ier == ARK_RTFUNC_FAIL) { return (ARK_RTFUNC_FAIL); }
  for (i = 0; i < rootmem->nrtfn; i++)
  {
    if (!rootmem->gactive[i] && rootmem->grout[i] != ZERO)
    {
      rootmem->gactive[i] = SUNTRUE;
    }
  }
  rootmem->tlo = rootmem->trout;
  for (i = 0; i < rootmem->nrtfn; i++) { rootmem->glo[i] = rootmem->grout[i]; }

  /* If no root found, return ARK_SUCCESS. */
  if (ier == ARK_SUCCESS) { return (ARK_SUCCESS); }

  /* If a root was found, interpolate to get y(trout) and return.  */
  (void)ARKodeGetDky(ark_mem, rootmem->trout, 0, ark_mem->ycur);
  return (RTFOUND);
}